

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_set_preview(exr_context_t ctxt,int part_index,char *name,exr_attr_preview_t *val)

{
  undefined8 uVar1;
  int *in_RCX;
  exr_attribute_list_t *in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_attribute_list_t *unaff_retaddr;
  exr_context_t in_stack_00000008;
  size_t copybytes;
  exr_priv_part_t part;
  exr_attribute_t **in_stack_00000020;
  exr_result_t rv;
  exr_attribute_t *attr;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint8_t *in_stack_ffffffffffffffb8;
  exr_attr_preview_t *p;
  uint in_stack_ffffffffffffffc8;
  exr_context_t ctxt_00;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar2;
  
  ctxt_00 = (exr_context_t)0x0;
  if (in_RDI == (char *)0x0) {
    eVar2 = 2;
  }
  else {
    internal_exr_lock((exr_const_context_t_conflict)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock((exr_const_context_t_conflict)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      eVar2 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      p = *(exr_attr_preview_t **)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (*in_RDI == '\0') {
        internal_exr_unlock((exr_const_context_t_conflict)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        eVar2 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
      }
      else if (*in_RDI == '\x03') {
        internal_exr_unlock((exr_const_context_t_conflict)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        eVar2 = (**(code **)(in_RDI + 0x38))(in_RDI,0x15);
      }
      else {
        eVar2 = exr_attr_list_find_by_name
                          ((exr_const_context_t_conflict)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           in_RDX,(char *)in_RCX,(exr_attribute_t **)ctxt_00);
        if (in_RCX == (int *)0x0) {
          internal_exr_unlock((exr_const_context_t_conflict)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          eVar2 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,3,"No input value for setting \'%s\', type \'preview\'",in_RDX);
        }
        else {
          if (eVar2 == 0xf) {
            if ((*in_RDI != '\x01') && (*in_RDI != '\x04')) {
              internal_exr_unlock((exr_const_context_t_conflict)
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
              return eVar2;
            }
            eVar2 = exr_attr_list_add(in_stack_00000008,unaff_retaddr,
                                      (char *)CONCAT44(in_stack_fffffffffffffffc,
                                                       in_stack_fffffffffffffff8),
                                      (exr_attribute_type_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,
                                      (uint8_t **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                      in_stack_00000020);
            if (eVar2 == 0) {
              eVar2 = exr_attr_preview_create
                                (ctxt_00,(exr_attr_preview_t *)(ulong)in_stack_ffffffffffffffc8,
                                 (uint32_t)((ulong)p >> 0x20),(uint32_t)p,in_stack_ffffffffffffffb8)
              ;
            }
          }
          else if (eVar2 == 0) {
            if (*(int *)((long)&(ctxt_00->filename).str + 4) != 0x11) {
              internal_exr_unlock((exr_const_context_t_conflict)
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
              uVar1._0_4_ = (ctxt_00->filename).length;
              uVar1._4_4_ = (ctxt_00->filename).alloc_size;
              eVar2 = (**(code **)(in_RDI + 0x48))
                                (in_RDI,0x10,
                                 "\'%s\' requested type \'preview\', but attribute is type \'%s\'",
                                 in_RDX,uVar1);
              return eVar2;
            }
            if (((**(int **)&ctxt_00->tmp_filename == *in_RCX) &&
                (*(int *)(*(long *)&ctxt_00->tmp_filename + 4) == in_RCX[1])) &&
               (*(long *)(*(long *)&ctxt_00->tmp_filename + 8) != 0)) {
              memcpy(*(void **)(*(long *)&ctxt_00->tmp_filename + 0x10),*(void **)(in_RCX + 4),
                     (ulong)(uint)(*in_RCX * in_RCX[1] * 4));
            }
            else {
              if ((*in_RDI != '\x01') && (*in_RDI != '\x04')) {
                internal_exr_unlock((exr_const_context_t_conflict)
                                    CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
                eVar2 = (**(code **)(in_RDI + 0x48))
                                  (in_RDI,0x14,
                                   "Existing preview \'%s\' is %u x %u, requested is %u x %u, unable to change"
                                   ,in_RDX,**(undefined4 **)&ctxt_00->tmp_filename,
                                   *(undefined4 *)(*(long *)&ctxt_00->tmp_filename + 4),*in_RCX,
                                   in_RCX[1]);
                return eVar2;
              }
              exr_attr_preview_destroy((exr_context_t)(ulong)in_stack_ffffffffffffffc8,p);
              eVar2 = exr_attr_preview_create
                                (ctxt_00,(exr_attr_preview_t *)
                                         CONCAT44(eVar2,in_stack_ffffffffffffffc8),
                                 (uint32_t)((ulong)p >> 0x20),(uint32_t)p,in_stack_ffffffffffffffb8)
              ;
            }
          }
          internal_exr_unlock((exr_const_context_t_conflict)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        }
      }
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_set_preview (
    exr_context_t             ctxt,
    int                       part_index,
    const char*               name,
    const exr_attr_preview_t* val)
{
    exr_attribute_t* attr = NULL;
    exr_result_t     rv   = EXR_ERR_SUCCESS;

    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (ctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (ctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_ALREADY_WROTE_ATTRS));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (!val)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input value for setting '%s', type 'preview'",
            name));

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (ctxt->mode != EXR_CONTEXT_WRITE && ctxt->mode != EXR_CONTEXT_TEMPORARY) return EXR_UNLOCK_AND_RETURN (rv);

        rv = exr_attr_list_add (
            ctxt,
            &(part->attributes),
            name,
            EXR_ATTR_PREVIEW,
            0,
            NULL,
            &(attr));
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_attr_preview_create (
                ctxt, attr->preview, val->width, val->height, val->rgba);
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_PREVIEW)
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type 'preview', but attribute is type '%s'",
                name,
                attr->type_name));

        if (attr->preview->width == val->width &&
            attr->preview->height == val->height &&
            attr->preview->alloc_size > 0)
        {
            size_t copybytes = val->width * val->height * 4;
            memcpy (
                EXR_CONST_CAST (void*, attr->preview->rgba),
                val->rgba,
                copybytes);
        }
        else if (ctxt->mode != EXR_CONTEXT_WRITE && ctxt->mode != EXR_CONTEXT_TEMPORARY)
        {
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing preview '%s' is %u x %u, requested is %u x %u, unable to change",
                name,
                attr->preview->width,
                attr->preview->height,
                val->width,
                val->height));
        }
        else
        {
            exr_attr_preview_destroy (ctxt, attr->preview);
            rv = exr_attr_preview_create (
                ctxt, attr->preview, val->width, val->height, val->rgba);
        }
    }
    return EXR_UNLOCK_AND_RETURN (rv);
}